

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::assignBufferToVAO
          (GLShaderProgram *this,GLShaderAttribute *a)

{
  int iVar1;
  invalid_argument *this_00;
  GLenum GVar2;
  int iVar3;
  long lVar4;
  GLint GVar5;
  GLuint GVar6;
  int iVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  
  (*glad_glBindVertexArray)(this->vaoHandle);
  (*glad_glBindBuffer)
            (0x8892,((a->buff).
                     super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLAttributeBuffer,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->VBOLoc);
  checkGLError(true);
  if (0 < a->arrayCount) {
    pvVar11 = (void *)0x0;
    pvVar12 = (void *)0x0;
    pvVar9 = (void *)0x0;
    pvVar10 = (void *)0x0;
    lVar4 = 0;
    do {
      iVar3 = (int)lVar4;
      (*glad_glEnableVertexAttribArray)(a->location + iVar3);
      switch(a->type) {
      case Vector2Float:
        iVar1 = a->location;
        iVar7 = a->arrayCount;
        GVar2 = 0x1406;
        goto LAB_00284b16;
      case Vector3Float:
        iVar1 = a->location;
        iVar7 = a->arrayCount;
        GVar2 = 0x1406;
        goto LAB_00284af8;
      case Vector4Float:
        iVar1 = a->location;
        iVar7 = a->arrayCount;
        GVar2 = 0x1406;
        goto LAB_00284a9f;
      default:
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this_00,"Unrecognized GLShaderAttribute type");
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      case Float:
        GVar6 = a->location + iVar3;
        iVar7 = a->arrayCount << 2;
        GVar2 = 0x1406;
        break;
      case Int:
        GVar6 = a->location + iVar3;
        iVar7 = a->arrayCount << 2;
        GVar2 = 0x1404;
        break;
      case UInt:
        GVar6 = a->location + iVar3;
        iVar7 = a->arrayCount << 2;
        GVar2 = 0x1405;
        break;
      case Vector2UInt:
        iVar1 = a->location;
        iVar7 = a->arrayCount;
        GVar2 = 0x1405;
LAB_00284b16:
        iVar7 = iVar7 << 3;
        GVar6 = iVar1 + iVar3;
        GVar5 = 2;
        pvVar8 = pvVar12;
        goto LAB_00284b1b;
      case Vector3UInt:
        iVar1 = a->location;
        iVar7 = a->arrayCount;
        GVar2 = 0x1405;
LAB_00284af8:
        iVar7 = iVar7 * 0xc;
        GVar6 = iVar1 + iVar3;
        GVar5 = 3;
        pvVar8 = pvVar9;
        goto LAB_00284b1b;
      case Vector4UInt:
        iVar1 = a->location;
        iVar7 = a->arrayCount;
        GVar2 = 0x1405;
LAB_00284a9f:
        iVar7 = iVar7 << 4;
        GVar6 = iVar1 + iVar3;
        GVar5 = 4;
        pvVar8 = pvVar10;
        goto LAB_00284b1b;
      }
      GVar5 = 1;
      pvVar8 = pvVar11;
LAB_00284b1b:
      (*glad_glVertexAttribPointer)(GVar6,GVar5,GVar2,'\0',iVar7,pvVar8);
      lVar4 = lVar4 + 1;
      pvVar10 = (void *)((long)pvVar10 + 0x10);
      pvVar9 = (void *)((long)pvVar9 + 0xc);
      pvVar12 = (void *)((long)pvVar12 + 8);
      pvVar11 = (void *)((long)pvVar11 + 4);
    } while (lVar4 < a->arrayCount);
  }
  checkGLError(true);
  return;
}

Assistant:

void GLShaderProgram::assignBufferToVAO(GLShaderAttribute& a) {
  bindVAO();
  a.buff->bind();
  checkGLError();

  // Choose the correct type for the buffer
  for (int iArrInd = 0; iArrInd < a.arrayCount; iArrInd++) {

    glEnableVertexAttribArray(a.location + iArrInd);

    switch (a.type) {
    case RenderDataType::Float:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_FLOAT, GL_FALSE, sizeof(float) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 1 * iArrInd));
      break;
    case RenderDataType::Int:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_INT, GL_FALSE, sizeof(int) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(int) * 1 * iArrInd));
      break;
    case RenderDataType::UInt:
      glVertexAttribPointer(a.location + iArrInd, 1, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 1 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 1 * iArrInd));
      break;
    case RenderDataType::Vector2Float:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_FLOAT, GL_FALSE, sizeof(float) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3Float:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_FLOAT, GL_FALSE, sizeof(float) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4Float:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_FLOAT, GL_FALSE, sizeof(float) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(float) * 4 * iArrInd));
      break;
    case RenderDataType::Vector2UInt:
      glVertexAttribPointer(a.location + iArrInd, 2, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 2 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 2 * iArrInd));
      break;
    case RenderDataType::Vector3UInt:
      glVertexAttribPointer(a.location + iArrInd, 3, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 3 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 3 * iArrInd));
      break;
    case RenderDataType::Vector4UInt:
      glVertexAttribPointer(a.location + iArrInd, 4, GL_UNSIGNED_INT, GL_FALSE, sizeof(uint32_t) * 4 * a.arrayCount,
                            reinterpret_cast<void*>(sizeof(uint32_t) * 4 * iArrInd));
      break;
    default:
      throw std::invalid_argument("Unrecognized GLShaderAttribute type");
      break;
    }
  }

  checkGLError();
}